

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.hpp
# Opt level: O0

string * __thiscall qclab::qasm_abi_cxx11_(string *__return_storage_ptr__,qclab *this,double angle)

{
  ulong uVar1;
  allocator local_3d;
  int local_3c;
  char local_38 [4];
  int size;
  char buffer [32];
  double angle_local;
  
  buffer._24_8_ = angle;
  local_3c = sprintf(local_38,"%.15f",angle);
  uVar1 = (ulong)local_3c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_38,uVar1,&local_3d);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d);
  return __return_storage_ptr__;
}

Assistant:

inline auto qasm( const double angle ) {
    char buffer[32] ;
    int size = std::sprintf( buffer , "%.15f" , angle ) ;
    return std::string( buffer , size ) ;
  }